

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenelinearindex_p.h
# Opt level: O0

void __thiscall
QGraphicsSceneLinearIndex::removeItem(QGraphicsSceneLinearIndex *this,QGraphicsItem *item)

{
  bool bVar1;
  iterator __last;
  qsizetype qVar2;
  iterator iVar3;
  iterator pos;
  QGraphicsItem **ppQVar4;
  QGraphicsItem *in_RSI;
  long in_RDI;
  long in_FS_OFFSET;
  iterator element;
  qsizetype in_stack_ffffffffffffff58;
  QList<QGraphicsItem_*> *in_stack_ffffffffffffff60;
  iterator in_stack_ffffffffffffff78;
  iterator in_stack_ffffffffffffff80;
  iterator in_stack_ffffffffffffff88;
  iterator in_stack_ffffffffffffff98;
  const_iterator local_30;
  iterator local_28;
  QGraphicsItem **local_20;
  QGraphicsItem **local_18;
  QGraphicsItem *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  __last.i = (QGraphicsItem **)(long)*(int *)(in_RDI + 0x28);
  local_10 = in_RSI;
  qVar2 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x10));
  if ((long)__last.i < qVar2) {
    local_18 = (QGraphicsItem **)QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff60);
    QList<QGraphicsItem_*>::iterator::operator+
              ((iterator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff60);
    std::sort<QList<QGraphicsItem*>::iterator>(in_stack_ffffffffffffff78,__last);
    QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff60);
    local_20 = (QGraphicsItem **)QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff60);
    QList<QGraphicsItem_*>::iterator::operator+
              ((iterator *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    in_stack_ffffffffffffff98 = QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff60);
    std::inplace_merge<QList<QGraphicsItem*>::iterator>
              (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    qVar2 = QList<QGraphicsItem_*>::size((QList<QGraphicsItem_*> *)(in_RDI + 0x10));
    *(int *)(in_RDI + 0x28) = (int)qVar2;
  }
  local_28.i = (QGraphicsItem **)&DAT_aaaaaaaaaaaaaaaa;
  iVar3 = QList<QGraphicsItem_*>::begin(in_stack_ffffffffffffff60);
  pos = QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff60);
  local_28 = std::lower_bound<QList<QGraphicsItem*>::iterator,QGraphicsItem*>
                       (in_stack_ffffffffffffff98,iVar3,__last.i);
  iVar3 = QList<QGraphicsItem_*>::end(in_stack_ffffffffffffff60);
  bVar1 = QList<QGraphicsItem_*>::iterator::operator!=(&local_28,iVar3);
  if ((bVar1) &&
     (ppQVar4 = QList<QGraphicsItem_*>::iterator::operator*(&local_28), *ppQVar4 == local_10)) {
    QList<QGraphicsItem_*>::const_iterator::const_iterator(&local_30,local_28);
    QList<QGraphicsItem_*>::erase((QList<QGraphicsItem_*> *)__last.i,(const_iterator)pos.i);
    *(int *)(in_RDI + 0x28) = *(int *)(in_RDI + 0x28) + -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

virtual void removeItem(QGraphicsItem *item) override
    {
        // Sort m_items if needed
        if (m_numSortedElements < m_items.size())
        {
            std::sort(m_items.begin() + m_numSortedElements, m_items.end() );
            std::inplace_merge(m_items.begin(), m_items.begin() + m_numSortedElements, m_items.end());
            m_numSortedElements = m_items.size();
        }

        QList<QGraphicsItem*>::iterator element = std::lower_bound(m_items.begin(), m_items.end(), item);
        if (element != m_items.end() && *element == item)
        {
            m_items.erase(element);
            --m_numSortedElements;
        }
    }